

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

string * __thiscall pbrt::syntactic::ParamArray<bool>::toString_abi_cxx11_(ParamArray<bool> *this)

{
  bool bVar1;
  ostream *poVar2;
  vector<bool,_std::allocator<bool>_> *pvVar3;
  undefined8 *in_RSI;
  string *in_RDI;
  size_t i;
  stringstream ss;
  ostream *in_stack_fffffffffffffde8;
  ParamArray<bool> *this_00;
  vector<bool,_std::allocator<bool>_> *this_01;
  vector<bool,_std::allocator<bool>_> *pvVar4;
  string local_1b8 [32];
  stringstream local_198 [16];
  ParamArray<bool> local_188 [4];
  
  std::__cxx11::stringstream::stringstream(local_198);
  (**(code **)*in_RSI)(local_1b8);
  poVar2 = std::operator<<((ostream *)local_188,local_1b8);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string(local_1b8);
  std::operator<<((ostream *)local_188,"[ ");
  this_01 = (vector<bool,_std::allocator<bool>_> *)0x0;
  while( true ) {
    pvVar4 = this_01;
    pvVar3 = (vector<bool,_std::allocator<bool>_> *)
             std::vector<bool,_std::allocator<bool>_>::size(this_01);
    if (pvVar3 <= this_01) break;
    this_00 = local_188;
    bVar1 = get(this_00,(size_t)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffde8 = (ostream *)std::ostream::operator<<(this_00,bVar1);
    std::operator<<(in_stack_fffffffffffffde8," ");
    this_01 = (vector<bool,_std::allocator<bool>_> *)
              ((long)&(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
  }
  std::operator<<((ostream *)local_188,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string ParamArray<bool>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      for (size_t i=0;i<this->size();i++)
        ss << get(i) << " ";
      ss << "]";
      return ss.str();
    }